

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# power.h
# Opt level: O2

void __thiscall
mp::
PowConverter_MIP<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
::Convert2ExpLog(PowConverter_MIP<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                 *this,ItemType_conflict16 *con,int param_2)

{
  int iVar1;
  FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  *this_00;
  Var VVar2;
  _Type aiVar3;
  initializer_list<double> __l;
  initializer_list<int> __l_00;
  initializer_list<int> __l_01;
  allocator_type local_7a3;
  allocator_type local_7a2;
  allocator_type local_7a1;
  Var local_7a0;
  int local_79c;
  _Vector_base<int,_std::allocator<int>_> local_798;
  _Vector_base<int,_std::allocator<int>_> local_780;
  _Vector_base<double,_std::allocator<double>_> local_768;
  double local_750;
  LinTerms local_748;
  undefined1 local_6d0 [488];
  QuadTerms local_4e8;
  QuadAndLinTerms local_3a8;
  QuadraticExpr local_1f0;
  
  local_6d0._40_4_ =
       (con->super_CustomConstraintData<std::array<int,_2UL>,_std::array<int,_0UL>,_mp::PowId>).
       args_._M_elems[0];
  iVar1 = (con->super_CustomConstraintData<std::array<int,_2UL>,_std::array<int,_0UL>,_mp::PowId>).
          args_._M_elems[1];
  local_6d0._0_8_ = local_6d0 + 0x10;
  local_6d0._8_8_ = 0;
  local_6d0[0x10] = '\0';
  local_6d0._32_4_ = -1;
  local_6d0._36_4_ = CTX_NONE;
  VVar2 = FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>
          ::
          AssignResultVar2Args<mp::CustomFunctionalConstraint<std::array<int,1ul>,std::array<int,0ul>,mp::NumericFunctionalConstraintTraits,mp::LogId>>
                    ((FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>
                      *)(this->
                        super_BasicFuncConstrCvt<mp::PowConverter_MIP<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                        ).
                        super_BasicItemConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                        .mdl_cvt_,
                     (CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::LogId>
                      *)local_6d0);
  std::__cxx11::string::~string((string *)local_6d0);
  this_00 = (FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
             *)(this->
               super_BasicFuncConstrCvt<mp::PowConverter_MIP<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
               ).
               super_BasicItemConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
               .mdl_cvt_;
  local_748.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
  super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr =
       (ptr)&local_748.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.m_storage;
  local_748.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.m_storage.m_data[0] =
       (type)0x0;
  local_748.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.m_storage.m_data[1] =
       (type)0x0;
  local_748.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.m_storage.m_data[2] =
       (type)0x0;
  local_748.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.m_storage.m_data[3] =
       (type)0x0;
  local_748.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.m_storage.m_data[4] =
       (type)0x0;
  local_748.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.m_storage.m_data[5] =
       (type)0x0;
  local_748.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
  super_small_vector_data_base<int_*,_unsigned_long>.m_size = 0;
  local_748.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.m_storage.m_data[0] =
       (type)0x0;
  local_748.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.m_storage.m_data[1] =
       (type)0x0;
  local_748.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.m_storage.m_data[2] =
       (type)0x0;
  local_748.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.m_storage.m_data[3] =
       (type)0x0;
  local_748.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.m_storage.m_data[4] =
       (type)0x0;
  local_748.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.m_storage.m_data[5] =
       (type)0x0;
  local_748.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
  super_small_vector_data_base<double_*,_unsigned_long>.m_capacity = 6;
  local_748.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
  super_small_vector_data_base<double_*,_unsigned_long>.m_size = 0;
  local_748.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
  super_small_vector_data_base<int_*,_unsigned_long>.m_capacity = 6;
  local_748.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
  super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr =
       (ptr)&local_748.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.m_storage;
  local_750 = 1.0;
  __l._M_len = 1;
  __l._M_array = &local_750;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&local_768,__l,&local_7a1);
  __l_00._M_len = 1;
  __l_00._M_array = &local_79c;
  local_79c = iVar1;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_780,__l_00,&local_7a2);
  __l_01._M_len = 1;
  __l_01._M_array = &local_7a0;
  local_7a0 = VVar2;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_798,__l_01,&local_7a3);
  QuadTerms::QuadTerms
            (&local_4e8,(vector<double,_std::allocator<double>_> *)&local_768,
             (vector<int,_std::allocator<int>_> *)&local_780,
             (vector<int,_std::allocator<int>_> *)&local_798);
  QuadAndLinTerms::QuadAndLinTerms(&local_3a8,&local_748,&local_4e8);
  QuadAndLinTerms::QuadAndLinTerms(&local_1f0.super_QuadAndLinTerms,&local_3a8);
  local_1f0.constant_term_ = 0.0;
  QuadraticFunctionalConstraint::QuadraticFunctionalConstraint
            ((QuadraticFunctionalConstraint *)local_6d0,&local_1f0);
  aiVar3[0] = FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
              ::AssignResultVar2Args<mp::QuadraticFunctionalConstraint>
                        (this_00,(QuadraticFunctionalConstraint *)local_6d0);
  QuadraticFunctionalConstraint::~QuadraticFunctionalConstraint
            ((QuadraticFunctionalConstraint *)local_6d0);
  QuadAndLinTerms::~QuadAndLinTerms(&local_1f0.super_QuadAndLinTerms);
  QuadAndLinTerms::~QuadAndLinTerms(&local_3a8);
  QuadTerms::~QuadTerms(&local_4e8);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_798);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_780);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_768);
  LinTerms::~LinTerms(&local_748);
  local_6d0._0_8_ = local_6d0 + 0x10;
  local_6d0._8_8_ = 0;
  local_6d0[0x10] = '\0';
  local_6d0._32_4_ = -1;
  local_6d0._36_4_ = CTX_NONE;
  local_6d0._40_4_ = aiVar3[0];
  FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>
  ::
  RedefineVariable<mp::CustomFunctionalConstraint<std::array<int,1ul>,std::array<int,0ul>,mp::NumericFunctionalConstraintTraits,mp::ExpId>>
            ((FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>
              *)(this->
                super_BasicFuncConstrCvt<mp::PowConverter_MIP<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                ).
                super_BasicItemConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                .mdl_cvt_,(con->super_FunctionalConstraint).result_var_,
             (CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::ExpId>
              *)local_6d0);
  std::__cxx11::string::~string((string *)local_6d0);
  FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  ::PropagateResultOfInitExpr
            ((FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
              *)(this->
                super_BasicFuncConstrCvt<mp::PowConverter_MIP<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                ).
                super_BasicItemConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                .mdl_cvt_,(con->super_FunctionalConstraint).result_var_,
             (Context)(con->super_FunctionalConstraint).ctx.value_);
  return;
}

Assistant:

void Convert2ExpLog(const ItemType& con, int ) {
    auto x = con.GetArguments()[0];
    auto y = con.GetArguments()[1];
    auto logx = GetMC().AssignResultVar2Args(
        LogConstraint{ {x} });
    auto y_logx = GetMC().AssignResultVar2Args(
        QuadraticFunctionalConstraint(
            QuadraticExpr(
                QuadAndLinTerms( { }, { {1.0}, {y}, {logx} } ),
                0.0) ));
    GetMC().RedefineVariable(con.GetResultVar(),
                             ExpConstraint({y_logx}));

    /// propagate ctx into new constr,
    /// particularly into the arguments which are new constraints
    GetMC().PropagateResultOfInitExpr(
        con.GetResultVar(), con.GetContext());
  }